

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_table.c
# Opt level: O2

void objc_init_load_messages_table(void)

{
  pthread_mutex_t *x;
  void *pvVar1;
  
  x = (pthread_mutex_t *)calloc(1,0x48);
  init_recursive_mutex(x);
  pvVar1 = calloc(0x1000,0x10);
  *(void **)((long)x + 0x40) = pvVar1;
  x[1].__data.__lock = 0x1000;
  load_table = (load_messages_table *)x;
  loadSel = sel_registerName("load");
  return;
}

Assistant:

PRIVATE void objc_init_load_messages_table(void)
{
	load_messages_initialize(&load_table, 4096);
	loadSel = sel_registerName("load");
}